

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_close(quicly_conn_t *conn,int err,char *reason_phrase)

{
  int iVar1;
  
  if ((((err & 0xffff0000U) != 0x30000 && err != 0) && (err != 0x201)) && (err != 0xff07)) {
    __assert_fail("err == 0 || QUICLY_ERROR_IS_QUIC_APPLICATION(err) || QUICLY_ERROR_IS_CONCEALED(err)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x120f,"int quicly_close(quicly_conn_t *, int, const char *)");
  }
  lock_now(conn,1);
  iVar1 = initiate_close(conn,err,0,reason_phrase);
  unlock_now(conn);
  return iVar1;
}

Assistant:

int quicly_close(quicly_conn_t *conn, int err, const char *reason_phrase)
{
    int ret;

    assert(err == 0 || QUICLY_ERROR_IS_QUIC_APPLICATION(err) || QUICLY_ERROR_IS_CONCEALED(err));

    lock_now(conn, 1);
    ret = initiate_close(conn, err, QUICLY_FRAME_TYPE_PADDING /* used when err == 0 */, reason_phrase);
    unlock_now(conn);

    return ret;
}